

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShadersIsolines::countIsolines
          (TessellationShadersIsolines *this,_test_result *test_result)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  reference pfVar4;
  size_type sVar5;
  float fVar6;
  float *found_y;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_58;
  iterator found_ys_iterator;
  float vertex_y;
  float *vertex;
  undefined1 local_38 [3];
  bool was_y_found;
  uint n_vertex;
  vector<float,_std::allocator<float>_> found_ys;
  float epsilon;
  _test_result *test_result_local;
  TessellationShadersIsolines *this_local;
  
  found_ys.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x3727c5ac;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  vertex._4_4_ = 0;
  do {
    if (test_result->n_vertices <= vertex._4_4_) {
      sVar5 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_38);
      test_result->n_isolines = (uint)sVar5;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_38);
      return;
    }
    bVar1 = false;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&test_result->rendered_data,0);
    found_ys_iterator._M_current._4_4_ = pvVar3[(ulong)(vertex._4_4_ * 3) + 1];
    local_58._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin
                            ((vector<float,_std::allocator<float>_> *)local_38);
    while( true ) {
      found_y = (float *)std::vector<float,_std::allocator<float>_>::end
                                   ((vector<float,_std::allocator<float>_> *)local_38);
      bVar2 = __gnu_cxx::operator!=
                        (&local_58,
                         (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                         &found_y);
      if (!bVar2) break;
      pfVar4 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_58);
      fVar6 = de::abs<float>(found_ys_iterator._M_current._4_4_ - *pfVar4);
      if (fVar6 < 1e-05) {
        bVar1 = true;
        break;
      }
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&local_58,0);
    }
    if (!bVar1) {
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)local_38,
                 (value_type_conflict2 *)((long)&found_ys_iterator._M_current + 4));
    }
    vertex._4_4_ = vertex._4_4_ + 1;
  } while( true );
}

Assistant:

void TessellationShadersIsolines::countIsolines(_test_result& test_result)
{
	const float		   epsilon = 1e-5f;
	std::vector<float> found_ys;

	for (unsigned int n_vertex = 0; n_vertex < test_result.n_vertices; ++n_vertex)
	{
		bool		 was_y_found = false;
		const float* vertex		 = (&test_result.rendered_data[0]) + n_vertex * 3; /* components */
		float		 vertex_y	= vertex[1];

		for (std::vector<float>::iterator found_ys_iterator = found_ys.begin(); found_ys_iterator != found_ys.end();
			 found_ys_iterator++)
		{
			float& found_y = *found_ys_iterator;

			if (de::abs(vertex_y - found_y) < epsilon)
			{
				was_y_found = true;

				break;
			}
		} /* for (all found Ys) */

		if (!was_y_found)
		{
			found_ys.push_back(vertex_y);
		}
	} /* for (all vertices) */

	/* Store the value */
	test_result.n_isolines = (unsigned int)found_ys.size();
}